

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key)

{
  int iVar1;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *ctx_00;
  code *pcVar2;
  aead_crypto_context_t *ctx_1;
  
  cipher = EVP_aes_128_gcm();
  pcVar2 = aead_do_encrypt;
  if (is_enc == 0) {
    pcVar2 = aead_do_decrypt;
  }
  ctx->dispose_crypto = aead_dispose_crypto;
  ctx->do_transform = pcVar2;
  ctx[1].algo = (st_ptls_aead_algorithm_t *)0x0;
  ctx[1].seq = 0x10;
  ctx_00 = EVP_CIPHER_CTX_new();
  ctx[1].algo = (st_ptls_aead_algorithm_t *)ctx_00;
  if (ctx_00 == (EVP_CIPHER_CTX *)0x0) {
    iVar1 = 0x201;
  }
  else {
    if (is_enc == 0) {
      iVar1 = EVP_DecryptInit_ex(ctx_00,cipher,(ENGINE *)0x0,(uchar *)key,(uchar *)0x0);
    }
    else {
      iVar1 = EVP_EncryptInit_ex(ctx_00,cipher,(ENGINE *)0x0,(uchar *)key,(uchar *)0x0);
    }
    if ((iVar1 != 0) &&
       (iVar1 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)ctx[1].algo,9,(int)ctx->algo->iv_size,
                                    (void *)0x0), iVar1 != 0)) {
      return 0;
    }
    iVar1 = 0x203;
    if ((EVP_CIPHER_CTX *)ctx[1].algo != (EVP_CIPHER_CTX *)0x0) {
      EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)ctx[1].algo);
    }
  }
  return iVar1;
}

Assistant:

static int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key)
{
    return aead_setup_crypto(ctx, is_enc, key, EVP_aes_128_gcm(), 16);
}